

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *this,
          compute_filtration_t *f,int min_dimension,int max_dimension,vertex_index_t *prefix,
          int prefix_size)

{
  bool bVar1;
  reference ppVar2;
  int in_ECX;
  int in_EDX;
  int iVar3;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_RSI;
  map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *in_RDI;
  long in_R8;
  int in_R9D;
  pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_> child;
  iterator __end0;
  iterator __begin0;
  map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *__range2;
  _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *this_00;
  _Self local_40;
  _Self local_38;
  _Base_ptr p_Var4;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar3 = in_R9D + 1;
  *(undefined2 *)(in_R8 + (long)in_R9D * 2) = *(undefined2 *)&(in_RDI->_M_t)._M_impl;
  if (in_EDX + 1 <= iVar3) {
    directed_flag_complex_in_memory_computer::compute_filtration_t::operator()
              ((compute_filtration_t *)child.second.children,(vertex_index_t *)child.second._8_8_,
               child.second.data.first,(pair<int,_float> *)child._0_8_);
  }
  if ((iVar3 != in_ECX + 1) &&
     ((in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)) {
    p_Var4 = (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::begin(in_RDI);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::end(in_RDI);
    while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                            *)0x1bee98);
      this_00 = *(_Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                  **)ppVar2;
      for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
                (in_RSI,(compute_filtration_t *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),
                 (int)in_R8,(vertex_index_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                 (int)((ulong)p_Var4 >> 0x20));
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
      ::operator++(this_00);
    }
  }
  return;
}

Assistant:

void for_each_cell(Func& f, int min_dimension, int max_dimension, vertex_index_t* prefix, int prefix_size = 0) {
		prefix[prefix_size++] = vertex;
		if (prefix_size >= min_dimension + 1) f(prefix, prefix_size, data);
		if (prefix_size == max_dimension + 1 || children == nullptr) return;

		for (auto child : *children) child.second.for_each_cell(f, min_dimension, max_dimension, prefix, prefix_size);
	}